

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CLOptions.h
# Opt level: O1

void __thiscall CLOptions::PrintStrings(CLOptions *this,bool detailed)

{
  bool bVar1;
  pointer ppVar2;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CLString_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CLString_*>_>_>
  *this_00;
  iterator iter;
  _Self local_30;
  _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CLString_*>_>
  local_28;
  
  this_00 = &this->params_strings;
  bVar1 = std::
          map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CLString_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CLString_*>_>_>
          ::empty(this_00);
  if (!bVar1) {
    if (detailed) {
      puts("*****************");
      puts("  STRINGS");
      puts("*****************");
    }
    std::
    _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CLString_*>_>
    ::_Rb_tree_iterator(&local_28);
    local_28._M_node =
         (_Base_ptr)
         std::
         map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CLString_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CLString_*>_>_>
         ::begin(this_00);
    local_30._M_node =
         (_Base_ptr)
         std::
         map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CLString_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CLString_*>_>_>
         ::end(this_00);
    bVar1 = std::operator!=(&local_28,&local_30);
    if (bVar1) {
      do {
        ppVar2 = std::
                 _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CLString_*>_>
                 ::operator->(&local_28);
        if (detailed) {
          CLParam<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::Print(&ppVar2->second->
                   super_CLParam<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 );
        }
        else {
          CLParam<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::PrintSimple(&ppVar2->second->
                         super_CLParam<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                       );
        }
        std::
        _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CLString_*>_>
        ::operator++(&local_28);
        local_30._M_node =
             (_Base_ptr)
             std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CLString_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CLString_*>_>_>
             ::end(this_00);
        bVar1 = std::operator!=(&local_28,&local_30);
      } while (bVar1);
    }
  }
  return;
}

Assistant:

void CLOptions::PrintStrings(bool detailed)
{
    // Dont do anything if the map is emtpy
    if (params_strings.empty()) return ;
    
    // Print a parameter header if doing detailed
    if (detailed) {
        std::printf("*****************\n") ;
        std::printf("  STRINGS\n") ;
        std::printf("*****************\n") ;
    }
    
    // Now loop through each of the parameters
    std::map<std::string, CLString*>::iterator iter ;
    for (iter=params_strings.begin(); iter!=params_strings.end(); ++iter) {
        if (detailed) {iter->second->Print() ;}
        else          {iter->second->PrintSimple() ;}
    }
}